

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

QString * QSettingsPrivate::normalizedKey(QAnyStringView key)

{
  bool bVar1;
  anon_class_8_1_ba1d6aae *paVar2;
  QChar *pQVar3;
  __off_t __length;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool maybeEndsInSlash;
  QString *result;
  QChar *out;
  undefined8 in_stack_ffffffffffffff88;
  Initialization IVar5;
  anon_class_8_1_ba1d6aae *paVar4;
  qsizetype in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  anon_class_8_1_ba1d6aae *local_20;
  QAnyStringView local_18;
  long local_8;
  
  IVar5 = (Initialization)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAnyStringView::size(&local_18);
  QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff90,IVar5);
  local_20 = (anon_class_8_1_ba1d6aae *)QString::constData((QString *)0x7a7371);
  bVar1 = QAnyStringView::visit<QSettingsPrivate::normalizedKey(QAnyStringView)::__0>
                    ((QAnyStringView *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                     ,local_20);
  if ((bVar1) &&
     (paVar4 = local_20, paVar2 = (anon_class_8_1_ba1d6aae *)QString::constData((QString *)0x7a73c9)
     , paVar4 != paVar2)) {
    local_20 = (anon_class_8_1_ba1d6aae *)((long)&local_20[-1].out + 6);
  }
  pQVar3 = QString::constData((QString *)0x7a7421);
  QString::truncate(in_RDI,(char *)((long)local_20 - (long)pQVar3 >> 1),__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QSettingsPrivate::normalizedKey(QAnyStringView key)
{
    QString result(key.size(), Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData()); // don't detach

    const bool maybeEndsInSlash = key.visit([&out](auto key) {
        using View = decltype(key);

        auto it = key.begin();
        const auto end = key.end();

        while (it != end) {
            while (*it == u'/') {
                ++it;
                if (it == end)
                    return true;
            }
            auto mark = it;
            while (*it != u'/') {
                ++it;
                if (it == end)
                    break;
            }
            out = write(out, View{mark, it});
            if (it == end)
                return false;
            Q_ASSERT(*it == u'/');
            *out++ = u'/';
            ++it;
        }
        return true;
    });

    if (maybeEndsInSlash && out != result.constData())
        --out; // remove the trailing slash
    result.truncate(out - result.constData());
    return result;
}